

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Scene *pSVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector3D local_60;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  
  pSVar4 = (this->super_SceneObject).scene;
  if (pSVar4 != (Scene *)0x0) {
    if ((Halfedge *)(pSVar4->selected).element == h) {
      lVar9 = 0x1e0;
      goto LAB_0016de20;
    }
    if ((Halfedge *)(pSVar4->hovered).element == h) {
      lVar9 = 0x1d8;
      goto LAB_0016de20;
    }
  }
  lVar9 = 0x1d0;
LAB_0016de20:
  lVar9 = *(long *)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar9);
  glColor4fv(lVar9);
  glLineWidth(*(undefined4 *)(lVar9 + 0x50));
  p_Var5 = (h->_next)._M_node;
  p_Var6 = (h->_vertex)._M_node;
  p_Var7 = p_Var5[2]._M_prev;
  p_Var8 = p_Var5[2]._M_next[2]._M_prev;
  p_Var5 = p_Var7[1]._M_prev;
  p_Var1 = p_Var7[2]._M_next;
  p_Var2 = p_Var6[1]._M_prev;
  p_Var3 = p_Var6[2]._M_next;
  p_Var7 = p_Var7[2]._M_prev;
  p_Var6 = p_Var6[2]._M_prev;
  local_30 = (((double)p_Var5 - (double)p_Var2) - ((double)p_Var2 - (double)p_Var8[1]._M_prev)) *
             0.5 * 0.2 + (double)p_Var2;
  local_28 = (((double)p_Var1 - (double)p_Var3) - ((double)p_Var3 - (double)p_Var8[2]._M_next)) *
             0.5 * 0.2 + (double)p_Var3;
  local_20 = (((double)p_Var7 - (double)p_Var6) - ((double)p_Var6 - (double)p_Var8[2]._M_prev)) *
             0.5 * 0.2 + (double)p_Var6;
  local_48 = (((double)p_Var8[1]._M_prev - (double)p_Var5) - ((double)p_Var5 - (double)p_Var2)) *
             0.5 * 0.2 + (double)p_Var5;
  local_40 = (((double)p_Var8[2]._M_next - (double)p_Var1) - ((double)p_Var1 - (double)p_Var3)) *
             0.5 * 0.2 + (double)p_Var1;
  local_38 = (((double)p_Var8[2]._M_prev - (double)p_Var7) - ((double)p_Var7 - (double)p_Var6)) *
             0.5 * 0.2 + (double)p_Var7;
  dVar15 = (local_48 - local_30) * 0.2;
  dVar13 = (local_40 - local_28) * 0.2;
  dVar14 = (local_38 - local_20) * 0.2;
  Face::normal(&local_60,(Face *)((h->_face)._M_node + 1));
  dVar12 = dVar15 * local_60.y;
  dVar11 = dVar14 * local_60.x;
  dVar10 = local_60.x * dVar13;
  local_60.x = (local_60.y * dVar14 - dVar13 * local_60.z) * 0.49999999999999994 +
               (local_48 - dVar15 * 0.8660254037844387);
  local_60.y = (local_60.z * dVar15 - dVar11) * 0.49999999999999994 +
               (local_40 - dVar13 * 0.8660254037844387);
  local_60.z = (dVar10 - dVar12) * 0.49999999999999994 + (local_38 - dVar14 * 0.8660254037844387);
  glBegin(3);
  glVertex3dv(&local_30);
  glVertex3dv(&local_48);
  glVertex3dv(&local_60);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}